

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void automatics(tgestate_t *state)

{
  byte bVar1;
  uint8_t uVar2;
  tgestate_t *in_RDI;
  tgestate_t *unaff_retaddr;
  vischar_t *in_stack_00000008;
  character_t character;
  vischar_t *vischar;
  uint8_t iters;
  undefined8 in_stack_ffffffffffffffe8;
  item_t item;
  vischar_t *pvVar3;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  char cVar4;
  
  item = (item_t)((ulong)in_stack_ffffffffffffffe8 >> 0x38);
  in_RDI->entered_move_a_character = '\0';
  if (in_RDI->bell == '\0') {
    hostiles_pursue(in_RDI);
  }
  if ((in_RDI->food_discovered_counter != '\0') &&
     (uVar2 = in_RDI->food_discovered_counter + 0xff, in_RDI->food_discovered_counter = uVar2,
     uVar2 == '\0')) {
    in_RDI->item_structs[7].item_and_flags = in_RDI->item_structs[7].item_and_flags & 0xdf;
    item_discovered((tgestate_t *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),item
                   );
  }
  in_RDI->IY = in_RDI->vischars + 1;
  cVar4 = '\a';
  do {
    pvVar3 = in_RDI->IY;
    if (pvVar3->flags != 0xff) {
      bVar1 = pvVar3->character;
      if (bVar1 < 0x14) {
        is_item_discoverable((tgestate_t *)CONCAT17(cVar4,in_stack_fffffffffffffff0));
        if ((in_RDI->red_flag != '\0') || (in_RDI->automatic_player_counter != '\0')) {
          guards_follow_suspicious_character(unaff_retaddr,(vischar_t *)in_RDI);
        }
        if ((0xf < bVar1) && ((in_RDI->item_structs[7].room_and_flags & 0x80) != 0)) {
          pvVar3->flags = '\x03';
        }
      }
      character_behaviour((tgestate_t *)vischar,in_stack_00000008);
    }
    in_RDI->IY = in_RDI->IY + 1;
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  if ((in_RDI->red_flag == '\0') &&
     ((in_RDI->in_solitary != '\0' || (in_RDI->automatic_player_counter == '\0')))) {
    in_RDI->IY = in_RDI->vischars;
    character_behaviour((tgestate_t *)vischar,in_stack_00000008);
  }
  return;
}

Assistant:

void automatics(tgestate_t *state)
{
  uint8_t iters; /* was B */

  assert(state != NULL);

  /* (I've still no idea what this flag means). */
  state->entered_move_a_character = 0;

  /* If the bell is ringing, hostiles pursue. */
  if (state->bell == bell_RING_PERPETUAL)
    hostiles_pursue(state);

  /* If food was dropped then count down until it is discovered. */
  if (state->food_discovered_counter != 0 &&
      --state->food_discovered_counter == 0)
  {
    /* De-poison the food. */
    state->item_structs[item_FOOD].item_and_flags &= ~itemstruct_ITEM_FLAG_POISONED;
    item_discovered(state, item_FOOD);
  }

  /* Make supporting characters react (if flags are set). */
  state->IY = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    vischar_t *vischar; /* was IY/new local copy */

    vischar = state->IY; // cache

    if (vischar->flags != vischar_FLAGS_EMPTY_SLOT)
    {
      character_t character; /* was A */

      character = vischar->character; /* Conv: Removed redundant mask op. */
      assert(character != character_NONE);
      if (character <= character_19_GUARD_DOG_4) /* Hostile characters only. */
      {
        /* Characters 0..19. */

        is_item_discoverable(state);

        if (state->red_flag || state->automatic_player_counter > 0)
          guards_follow_suspicious_character(state, vischar);

        /* If there is (poisoned) food nearby then put the guard dogs
         * (characters 16..19) into vischar_PURSUIT_DOG_FOOD pursue mode. */
        if (character >= character_16_GUARD_DOG_1 &&
            state->item_structs[item_FOOD].room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
            vischar->flags = vischar_PURSUIT_DOG_FOOD;
      }

      character_behaviour(state, vischar);
    }

    state->IY++;
  }
  while (--iters);

  /* Engage automatic behaviour for the hero unless the flag is red, the
   * hero is in solitary or an input event was recently received. */
  if (state->red_flag)
    return;
  if (state->in_solitary || state->automatic_player_counter == 0)
  {
    state->IY = &state->vischars[0];
    character_behaviour(state, state->IY);
  }
}